

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPMCanvas.h
# Opt level: O0

void __thiscall
adapt::gpm2::detail::GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D>::Flush
          (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this)

{
  GPMCanvas *this_00;
  bool bVar1;
  NotInitialized *this_01;
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this_02;
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *pGVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined8 local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined8 local_c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *local_68;
  GPMGraphParam2D *i;
  iterator __end0;
  iterator __begin0;
  vector<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
  *__range3;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string c;
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this_local;
  
  c.field_2._8_8_ = this;
  if (this->mCanvas == (GPMCanvas *)0x0) {
    this_01 = (NotInitialized *)__cxa_allocate_exception(0x28);
    adapt::cuf::NotInitialized::Exception(this_01,"Buffer is empty");
    __cxa_throw(this_01,&adapt::cuf::NotInitialized::typeinfo,
                adapt::cuf::NotInitialized::~NotInitialized);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"plot",&local_31);
  std::allocator<char>::~allocator(&local_31);
  __end0 = std::
           vector<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
           ::begin(&this->mParam);
  i = (GPMGraphParam2D *)
      std::
      vector<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
      ::end(&this->mParam);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<adapt::gpm2::detail::GPMGraphParam2D_*,_std::vector<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>_>
                                *)&i);
    if (!bVar1) break;
    this_02 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
              __gnu_cxx::
              __normal_iterator<adapt::gpm2::detail::GPMGraphParam2D_*,_std::vector<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>_>
              ::operator*(&__end0);
    pGVar2 = this_02;
    local_68 = this_02;
    bVar1 = GPMCanvas::IsInMemoryDataTransferEnabled(this->mCanvas);
    PlotCommand_abi_cxx11_(&local_a8,this_02,(GPMGraphParam2D *)(ulong)bVar1,SUB81(pGVar2,0));
    std::operator+(&local_88,&local_a8,", ");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    __gnu_cxx::
    __normal_iterator<adapt::gpm2::detail::GPMGraphParam2D_*,_std::vector<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>_>
    ::operator++(&__end0);
  }
  local_c0._M_current = (char *)std::__cxx11::string::end();
  local_b8 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator-(&local_c0,2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b0,&local_b8);
  local_d0._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_c8,&local_d0);
  local_d8 = std::__cxx11::string::erase(local_30,local_b0,local_c8);
  GPMCanvas::Command<std::__cxx11::string&>
            (this->mCanvas,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  this_00 = this->mCanvas;
  InitCommand_abi_cxx11_();
  GPMCanvas::Command<std::__cxx11::string>(this_00,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

inline void GPMPlotBuffer2D<GraphParam>::Flush()
{
	if (mCanvas == nullptr) throw NotInitialized("Buffer is empty");
	std::string c = "plot";
	for (auto& i : mParam)
	{
		c += PlotCommand(i, mCanvas->IsInMemoryDataTransferEnabled()) + ", ";
	}
	c.erase(c.end() - 2, c.end());
	mCanvas->Command(c);
	mCanvas->Command(InitCommand());
}